

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O2

object_ptr __thiscall
mjs::make_regexp(mjs *this,gc_heap_ptr<mjs::global_object> *global,string *pattern,string *flags)

{
  global_object *global_00;
  undefined8 extraout_RDX;
  object_ptr oVar1;
  gc_heap_ptr_untyped local_40;
  wstring_view local_30;
  
  local_30 = string::view(pattern);
  global_00 = (global_object *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  parse_regexp_flags(global_00,flags);
  regexp_object::make((gc_heap_ptr<mjs::global_object> *)&local_40,(wstring_view *)global,
                      (regexp_flag)&local_30);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)this,&local_40);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_40);
  oVar1.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar1.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar1.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr make_regexp(const gc_heap_ptr<global_object>& global, const string& pattern, const string& flags) {
    return regexp_object::make(global, pattern.view(), parse_regexp_flags(*global, flags));
}